

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O0

void __thiscall
icu_63::Normalizer2DataBuilder::Normalizer2DataBuilder
          (Normalizer2DataBuilder *this,UErrorCode *errorCode)

{
  UErrorCode *errorCode_local;
  Normalizer2DataBuilder *this_local;
  
  Norms::Norms(&this->norms,errorCode);
  this->phase = 0;
  this->overrideHandling = OVERRIDE_PREVIOUS;
  this->optimization = OPTIMIZE_NORMAL;
  this->norm16TrieBytes = (uint8_t *)0x0;
  this->norm16TrieLength = 0;
  UnicodeString::UnicodeString(&this->extraData);
  memset(this->unicodeVersion,0,4);
  memset(this->indexes,0,0x50);
  memset(this->smallFCD,0,0x100);
  return;
}

Assistant:

Normalizer2DataBuilder::Normalizer2DataBuilder(UErrorCode &errorCode) :
        norms(errorCode),
        phase(0), overrideHandling(OVERRIDE_PREVIOUS), optimization(OPTIMIZE_NORMAL),
        norm16TrieBytes(nullptr), norm16TrieLength(0) {
    memset(unicodeVersion, 0, sizeof(unicodeVersion));
    memset(indexes, 0, sizeof(indexes));
    memset(smallFCD, 0, sizeof(smallFCD));
}